

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestDiscard(void)

{
  bool bVar1;
  size_type sVar2;
  exception *e;
  int chunks;
  size_t discarded;
  size_t remainder;
  size_t dataSize_3;
  OutputBuffer ob_3;
  size_t dataSize_2;
  OutputBuffer ob_2;
  size_t dataSize_1;
  OutputBuffer ob_1;
  size_t dataSize;
  OutputBuffer ob;
  lazy_ostream *in_stack_ffffffffffffead8;
  basic_cstring<const_char> *in_stack_ffffffffffffeae0;
  char *in_stack_ffffffffffffeae8;
  undefined4 in_stack_ffffffffffffeaf0;
  undefined4 in_stack_ffffffffffffeaf4;
  size_type in_stack_ffffffffffffeaf8;
  OutputBuffer *in_stack_ffffffffffffeb00;
  undefined4 in_stack_ffffffffffffeb08;
  undefined4 in_stack_ffffffffffffeb0c;
  OutputBuffer *in_stack_ffffffffffffeb10;
  const_string *in_stack_ffffffffffffeb18;
  const_string *msg;
  undefined7 in_stack_ffffffffffffeb20;
  undefined1 in_stack_ffffffffffffeb27;
  const_string *in_stack_ffffffffffffeb28;
  lazy_ostream *in_stack_ffffffffffffeb30;
  begin *in_stack_ffffffffffffeb48;
  unit_test_log_t *in_stack_ffffffffffffeb50;
  undefined1 local_1048 [24];
  undefined1 local_1030 [56];
  basic_cstring<const_char> local_ff8;
  undefined1 local_fe8 [24];
  undefined1 local_fd0 [56];
  basic_cstring<const_char> local_f98;
  basic_cstring<const_char> local_f88;
  basic_cstring<const_char> local_f78;
  undefined1 local_f68 [56];
  basic_cstring<const_char> local_f30;
  undefined1 local_f1c [28];
  undefined1 local_f00 [56];
  basic_cstring<const_char> local_ec8;
  undefined1 local_eb0 [24];
  undefined1 local_e98 [56];
  basic_cstring<const_char> local_e60;
  undefined1 local_e50 [24];
  undefined1 local_e38 [56];
  basic_cstring<const_char> local_e00;
  basic_cstring<const_char> local_df0;
  basic_cstring<const_char> local_de0;
  undefined1 local_dd0 [56];
  basic_cstring<const_char> local_d98;
  size_type local_d88;
  basic_cstring<const_char> local_d80;
  undefined1 local_d70 [56];
  basic_cstring<const_char> local_d38;
  int local_d24;
  basic_cstring<const_char> local_d20;
  undefined1 local_d10 [56];
  basic_cstring<const_char> local_cd8;
  undefined1 local_cc4 [8];
  int local_cbc;
  basic_cstring<const_char> local_cb8;
  undefined1 local_ca8 [56];
  basic_cstring<const_char> local_c70;
  basic_cstring<const_char> local_c60;
  basic_cstring<const_char> local_c50;
  undefined1 local_c40 [56];
  basic_cstring<const_char> local_c08;
  size_type local_bf8;
  basic_cstring<const_char> local_bf0;
  undefined1 local_be0 [56];
  basic_cstring<const_char> local_ba8;
  ulong local_b98;
  undefined1 local_b90 [12];
  int local_b84;
  basic_cstring<const_char> local_b80;
  undefined1 local_b70 [56];
  basic_cstring<const_char> local_b38;
  undefined1 local_b28 [24];
  undefined1 local_b10 [56];
  basic_cstring<const_char> local_ad8;
  basic_cstring<const_char> local_ac8;
  basic_cstring<const_char> local_ab8;
  undefined1 local_aa8 [56];
  basic_cstring<const_char> local_a70;
  size_type local_a60;
  basic_cstring<const_char> local_a58;
  undefined1 local_a48 [56];
  basic_cstring<const_char> local_a10;
  basic_cstring<const_char> local_a00;
  undefined1 local_9e8 [24];
  undefined1 local_9d0 [56];
  basic_cstring<const_char> local_998;
  undefined1 local_988 [24];
  undefined1 local_970 [56];
  basic_cstring<const_char> local_938;
  basic_cstring<const_char> local_928;
  basic_cstring<const_char> local_918;
  undefined1 local_908 [56];
  basic_cstring<const_char> local_8d0;
  basic_cstring<const_char> local_8c0;
  basic_cstring<const_char> local_8b0;
  undefined1 local_8a0 [56];
  basic_cstring<const_char> local_868;
  undefined1 local_858 [24];
  undefined1 local_840 [56];
  basic_cstring<const_char> local_808;
  undefined1 local_7f8 [24];
  undefined1 local_7e0 [56];
  basic_cstring<const_char> local_7a8;
  basic_cstring<const_char> local_798;
  basic_cstring<const_char> local_788;
  undefined1 local_778 [56];
  basic_cstring<const_char> local_740;
  size_type local_730;
  basic_cstring<const_char> local_728;
  undefined1 local_718 [56];
  basic_cstring<const_char> local_6e0;
  basic_cstring<const_char> local_6d0;
  undefined1 local_6b8 [24];
  undefined1 local_6a0 [56];
  basic_cstring<const_char> local_668;
  undefined1 local_658 [24];
  undefined1 local_640 [56];
  basic_cstring<const_char> local_608;
  basic_cstring<const_char> local_5f8;
  basic_cstring<const_char> local_5e8;
  undefined1 local_5d8 [56];
  basic_cstring<const_char> local_5a0;
  size_type local_590;
  basic_cstring<const_char> local_588;
  undefined1 local_578 [56];
  basic_cstring<const_char> local_540;
  undefined1 local_530 [24];
  undefined1 local_518 [56];
  basic_cstring<const_char> local_4e0;
  undefined1 local_4d0 [24];
  undefined1 local_4b8 [56];
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  basic_cstring<const_char> local_460;
  undefined1 local_450 [56];
  basic_cstring<const_char> local_418;
  size_type local_408;
  basic_cstring<const_char> local_400;
  undefined1 local_3f0 [56];
  basic_cstring<const_char> local_3b8;
  basic_cstring<const_char> local_3a8;
  undefined1 local_390 [24];
  undefined1 local_378 [56];
  basic_cstring<const_char> local_340;
  undefined1 local_330 [24];
  undefined1 local_318 [56];
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  basic_cstring<const_char> local_2c0;
  undefined1 local_2b0 [56];
  basic_cstring<const_char> local_278;
  undefined1 local_264 [28];
  undefined1 local_248 [56];
  basic_cstring<const_char> local_210;
  undefined1 local_200 [24];
  undefined1 local_1e8 [56];
  basic_cstring<const_char> local_1b0;
  undefined1 local_1a0 [24];
  undefined1 local_188 [56];
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  undefined1 local_120 [56];
  basic_cstring<const_char> local_e8;
  size_type local_d8;
  basic_cstring<const_char> local_d0;
  undefined1 local_c0 [56];
  basic_cstring<const_char> local_88;
  basic_cstring<const_char> local_78 [4];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            ((begin *)CONCAT44(in_stack_ffffffffffffeaf4,in_stack_ffffffffffffeaf0),
             (const_string *)in_stack_ffffffffffffeae8,(size_t)in_stack_ffffffffffffeae0);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_ffffffffffffeae8,
             (log_level)((ulong)in_stack_ffffffffffffeae0 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [12])in_stack_ffffffffffffeae0);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]> *)
             0x228f84);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_ffffffffffffeae0);
  avro::OutputBuffer::OutputBuffer(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
  local_78[0].m_begin = (iterator)0x2800;
  addDataToBuffer((OutputBuffer *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                  (size_t)in_stack_ffffffffffffeb18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_d8 = avro::OutputBuffer::size((OutputBuffer *)0x229081);
    in_stack_ffffffffffffeae8 = "dataSize";
    in_stack_ffffffffffffeae0 = local_78;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_c0,&local_d0,0xa0,1,2,&local_d8,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2290fb);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_140.m_end = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x2291ce);
    local_140.m_begin = (iterator)0x800;
    in_stack_ffffffffffffeae8 = "kDefaultBlockSize/2";
    in_stack_ffffffffffffeae0 = &local_140;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_120,&local_130,0xa1,1,2,&local_140.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x229254);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1a0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1a0._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x229327);
    local_1a0._0_4_ = 1;
    in_stack_ffffffffffffeae8 = "1";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_1a0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_188,local_1a0 + 8,0xa2,1,2,local_1a0 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2293a9);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_200 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_200._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x22947c);
    local_200._0_4_ = 3;
    in_stack_ffffffffffffeae8 = "3";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_200;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1e8,local_200 + 8,0xa3,1,2,local_200 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2294fe);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::discardData((OutputBuffer *)0x22952a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_264 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_264._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x2295e0);
    local_264._0_4_ = 0;
    in_stack_ffffffffffffeae8 = "0U";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_264;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_248,local_264 + 0xc,0xa7,1,2,local_264 + 4,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x229665);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_2d0.m_end = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x229738);
    local_2d0.m_begin = (iterator)0x800;
    in_stack_ffffffffffffeae8 = "kDefaultBlockSize/2";
    in_stack_ffffffffffffeae0 = &local_2d0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_2b0,&local_2c0,0xa8,1,2,&local_2d0.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2297be);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_330 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_330._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x229891);
    local_330._0_4_ = 1;
    in_stack_ffffffffffffeae8 = "1";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_330;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_318,local_330 + 8,0xa9,1,2,local_330 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x229913);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_390 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_390._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x2299e6);
    local_390._0_4_ = 0;
    in_stack_ffffffffffffeae8 = "0";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_390;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_378,local_390 + 8,0xaa,1,2,local_390 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x229a68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x229a94);
  avro::OutputBuffer::OutputBuffer(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
  local_3a8.m_begin = (iterator)0x2800;
  addDataToBuffer((OutputBuffer *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                  (size_t)in_stack_ffffffffffffeb18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_400,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_408 = avro::OutputBuffer::size((OutputBuffer *)0x229b84);
    in_stack_ffffffffffffeae8 = "dataSize";
    in_stack_ffffffffffffeae0 = &local_3a8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_3f0,&local_400,0xb3,1,2,&local_408,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x229bfe);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_470.m_end = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x229cd1);
    local_470.m_begin = (iterator)0x800;
    in_stack_ffffffffffffeae8 = "kDefaultBlockSize/2";
    in_stack_ffffffffffffeae0 = &local_470;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_450,&local_460,0xb4,1,2,&local_470.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x229d57);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_4d0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_4d0._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x229e2a);
    local_4d0._0_4_ = 1;
    in_stack_ffffffffffffeae8 = "1";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_4d0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_4b8,local_4d0 + 8,0xb5,1,2,local_4d0 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x229eac);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_530 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_530._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x229f7f);
    local_530._0_4_ = 3;
    in_stack_ffffffffffffeae8 = "3";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_530;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_518,local_530 + 8,0xb6,1,2,local_530 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22a001);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::discardData
            (in_stack_ffffffffffffeb10,CONCAT44(in_stack_ffffffffffffeb0c,in_stack_ffffffffffffeb08)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_540,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_588,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_590 = avro::OutputBuffer::size((OutputBuffer *)0x22a0e7);
    in_stack_ffffffffffffeae8 = "dataSize";
    in_stack_ffffffffffffeae0 = &local_3a8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_578,&local_588,0xba,1,2,&local_590,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22a161);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_5f8.m_end = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x22a234);
    local_5f8.m_begin = (iterator)0x800;
    in_stack_ffffffffffffeae8 = "kDefaultBlockSize/2";
    in_stack_ffffffffffffeae0 = &local_5f8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_5d8,&local_5e8,0xbb,1,2,&local_5f8.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22a2ba);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_608,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_658 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_658._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x22a38d);
    local_658._0_4_ = 1;
    in_stack_ffffffffffffeae8 = "1";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_658;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_640,local_658 + 8,0xbc,1,2,local_658 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22a40f);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_668,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_6b8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_6b8._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x22a4e2);
    local_6b8._0_4_ = 3;
    in_stack_ffffffffffffeae8 = "3";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_6b8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_6a0,local_6b8 + 8,0xbd,1,2,local_6b8 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22a564);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x22a590);
  avro::OutputBuffer::OutputBuffer(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
  local_6d0.m_begin = (iterator)0x2800;
  addDataToBuffer((OutputBuffer *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                  (size_t)in_stack_ffffffffffffeb18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_728,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_730 = avro::OutputBuffer::size((OutputBuffer *)0x22a680);
    in_stack_ffffffffffffeae8 = "dataSize";
    in_stack_ffffffffffffeae0 = &local_6d0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_718,&local_728,0xc6,1,2,&local_730,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22a6fa);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_740,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_788,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_798.m_end = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x22a7cd);
    local_798.m_begin = (iterator)0x800;
    in_stack_ffffffffffffeae8 = "kDefaultBlockSize/2";
    in_stack_ffffffffffffeae0 = &local_798;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_778,&local_788,199,1,2,&local_798.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22a853);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_7f8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_7f8._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x22a926);
    local_7f8._0_4_ = 1;
    in_stack_ffffffffffffeae8 = "1";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_7f8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_7e0,local_7f8 + 8,200,1,2,local_7f8 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22a9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_808,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_858 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_858._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x22aa7b);
    local_858._0_4_ = 3;
    in_stack_ffffffffffffeae8 = "3";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_858;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_840,local_858 + 8,0xc9,1,2,local_858 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22aafd);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::discardData
            (in_stack_ffffffffffffeb10,CONCAT44(in_stack_ffffffffffffeb0c,in_stack_ffffffffffffeb08)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_868,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_8c0.m_end = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x22abe4);
    local_8c0.m_begin = local_6d0.m_begin + -0x1000;
    in_stack_ffffffffffffeae8 = "dataSize - kDefaultBlockSize";
    in_stack_ffffffffffffeae0 = &local_8c0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_8a0,&local_8b0,0xcd,1,2,&local_8c0.m_end,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22ac74);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_918,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_928.m_end = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x22ad47);
    local_928.m_begin = (iterator)0x800;
    in_stack_ffffffffffffeae8 = "kDefaultBlockSize/2";
    in_stack_ffffffffffffeae0 = &local_928;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_908,&local_918,0xce,1,2,&local_928.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22adcd);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_938,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_988 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_988._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x22aea0);
    local_988._0_4_ = 1;
    in_stack_ffffffffffffeae8 = "1";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_988;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_970,local_988 + 8,0xcf,1,2,local_988 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22af22);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_998,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_9e8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_9e8._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x22aff5);
    local_9e8._0_4_ = 2;
    in_stack_ffffffffffffeae8 = "2";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_9e8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_9d0,local_9e8 + 8,0xd0,1,2,local_9e8 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22b077);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x22b0a3);
  avro::OutputBuffer::OutputBuffer(in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8);
  local_a00.m_begin = (iterator)0x2800;
  addDataToBuffer((OutputBuffer *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                  (size_t)in_stack_ffffffffffffeb18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a10,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a58,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_a60 = avro::OutputBuffer::size((OutputBuffer *)0x22b193);
    in_stack_ffffffffffffeae8 = "dataSize";
    in_stack_ffffffffffffeae0 = &local_a00;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_a48,&local_a58,0xd8,1,2,&local_a60,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22b20d);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a70,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ab8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_ac8.m_end = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x22b2e0);
    local_ac8.m_begin = (iterator)0x800;
    in_stack_ffffffffffffeae8 = "kDefaultBlockSize/2";
    in_stack_ffffffffffffeae0 = &local_ac8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_aa8,&local_ab8,0xd9,1,2,&local_ac8.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22b366);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ad8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_b28 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_b28._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x22b439);
    local_b28._0_4_ = 1;
    in_stack_ffffffffffffeae8 = "1";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_b28;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_b10,local_b28 + 8,0xda,1,2,local_b28 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22b4bb);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b38,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_b84 = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x22b58e);
    local_b90._8_4_ = 3;
    in_stack_ffffffffffffeae8 = "3";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)(local_b90 + 8);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_b70,&local_b80,0xdb,1,2,&local_b84,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22b610);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_b90._0_8_ = (ulong)local_a00.m_begin % 100;
  local_b98 = 0;
  while (sVar2 = avro::OutputBuffer::size((OutputBuffer *)0x22b662), 100 < sVar2) {
    avro::OutputBuffer::discardData
              (in_stack_ffffffffffffeb10,
               CONCAT44(in_stack_ffffffffffffeb0c,in_stack_ffffffffffffeb08));
    local_a00.m_begin = local_a00.m_begin + -100;
    local_b98 = local_b98 + 100;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_ba8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
                 CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 in_stack_ffffffffffffeb18);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_bf0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      local_bf8 = avro::OutputBuffer::size((OutputBuffer *)0x22b76c);
      in_stack_ffffffffffffeae8 = "dataSize";
      in_stack_ffffffffffffeae0 = &local_a00;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_be0,&local_bf0,0xe6,1,2,&local_bf8,"ob.size()");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x22b7e6);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_c08,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
                 CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 in_stack_ffffffffffffeb18);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_c50,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      local_c60.m_end = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x22b8b9);
      local_c60.m_begin = (iterator)0x800;
      in_stack_ffffffffffffeae8 = "kDefaultBlockSize/2";
      in_stack_ffffffffffffeae0 = &local_c60;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_c40,&local_c50,0xe7,1,2,&local_c60.m_end,"ob.freeSpace()");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x22b93f);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_c70,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
                 CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 in_stack_ffffffffffffeb18);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_cb8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      local_cbc = avro::OutputBuffer::numChunks((OutputBuffer *)0x22ba12);
      local_cc4._4_4_ = 1;
      in_stack_ffffffffffffeae8 = "1";
      in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)(local_cc4 + 4);
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (local_ca8,&local_cb8,0xe8,1,2,&local_cbc,"ob.numChunks()");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x22ba94);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_cc4._0_4_ = 3 - (int)(local_b98 >> 0xc);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_cd8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
                 CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
                 in_stack_ffffffffffffeb18);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_d20,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      local_d24 = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x22bb80);
      in_stack_ffffffffffffeae8 = "chunks";
      in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_cc4;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (local_d10,&local_d20,0xeb,1,2,&local_d24,"ob.numDataChunks()");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x22bbf7);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d38,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_d88 = avro::OutputBuffer::size((OutputBuffer *)0x22c248);
    in_stack_ffffffffffffeae8 = "remainder";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_b90;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_d70,&local_d80,0xee,1,2,&local_d88,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22c2c2);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d98,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_de0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_df0.m_end = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x22c395);
    local_df0.m_begin = (iterator)0x800;
    in_stack_ffffffffffffeae8 = "kDefaultBlockSize/2";
    in_stack_ffffffffffffeae0 = &local_df0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_dd0,&local_de0,0xef,1,2,&local_df0.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22c41b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_e50 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_e50._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x22c4ee);
    local_e50._0_4_ = 1;
    in_stack_ffffffffffffeae8 = "1";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_e50;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_e38,local_e50 + 8,0xf0,1,2,local_e50 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22c570);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e60,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_eb0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_eb0._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x22c643);
    local_eb0._0_4_ = 1;
    in_stack_ffffffffffffeae8 = "1";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_eb0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_e98,local_eb0 + 8,0xf1,1,2,local_eb0 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22c6c5);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::size((OutputBuffer *)0x22c6f1);
  avro::OutputBuffer::discardData
            (in_stack_ffffffffffffeb10,CONCAT44(in_stack_ffffffffffffeb0c,in_stack_ffffffffffffeb08)
            );
  avro::OutputBuffer::size((OutputBuffer *)0x22c863);
  avro::OutputBuffer::discardData
            (in_stack_ffffffffffffeb10,CONCAT44(in_stack_ffffffffffffeb0c,in_stack_ffffffffffffeb08)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ec8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_f1c + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_f1c._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x22c932);
    local_f1c._0_4_ = 0;
    in_stack_ffffffffffffeae8 = "0U";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_f1c;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_f00,local_f1c + 0xc,0xfb,1,2,local_f1c + 4,"ob.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22c9b1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f30,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               in_stack_ffffffffffffeb18);
    in_stack_ffffffffffffeb30 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f78,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    in_stack_ffffffffffffeb28 =
         (const_string *)avro::OutputBuffer::freeSpace((OutputBuffer *)0x22ca72);
    local_f88.m_begin = (iterator)0x800;
    in_stack_ffffffffffffeae8 = "kDefaultBlockSize/2";
    in_stack_ffffffffffffeae0 = &local_f88;
    local_f88.m_end = (iterator)in_stack_ffffffffffffeb28;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_f68,&local_f78,0xfc,1,2,&local_f88.m_end,"ob.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22caf2);
    in_stack_ffffffffffffeb27 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffeb27);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f98,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_fe8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_fe8._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x22cbb3);
    local_fe8._0_4_ = 1;
    in_stack_ffffffffffffeae8 = "1";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_fe8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_fd0,local_fe8 + 8,0xfd,1,2,local_fe8 + 4,"ob.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22cc2f);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ff8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffeae0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
               CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffeae8,(char (*) [1])in_stack_ffffffffffffeae0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1048 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1048._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x22ccf0);
    local_1048._0_4_ = 0;
    in_stack_ffffffffffffeae8 = "0";
    in_stack_ffffffffffffeae0 = (basic_cstring<const_char> *)local_1048;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1030,local_1048 + 8,0xfe,1,2,local_1048 + 4,"ob.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22cd6c);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x22cd92);
  return;
}

Assistant:

void TestDiscard()
{
    BOOST_TEST_MESSAGE( "TestDiscard");
    {
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        ob.discardData();

        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }

    {
        // discard no bytes
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        ob.discardData(0);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);
    }

    { 
        // discard exactly one block
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        ob.discardData(kDefaultBlockSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize - kDefaultBlockSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 2);
    }

    {
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        size_t remainder = dataSize % 100;

        // discard data 100 bytes at a time
        size_t discarded = 0;
        while(ob.size() > 100) {
            ob.discardData(100);
            dataSize -= 100;
            discarded += 100;

            BOOST_CHECK_EQUAL(ob.size(), dataSize);
            BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
            BOOST_CHECK_EQUAL(ob.numChunks(), 1);

            int chunks = 3 - (discarded / kDefaultBlockSize);
            BOOST_CHECK_EQUAL(ob.numDataChunks(), chunks);
        }

        BOOST_CHECK_EQUAL(ob.size(), remainder);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 1);

        try {
            ob.discardData(ob.size()+1);
        }
        catch (std::exception &e) {
            std::cout << "Intentionally triggered exception: " << e.what() << std::endl; 
        }
        ob.discardData(ob.size());

        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }
}